

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetMetricStreamerClose(zet_metric_streamer_handle_t hMetricStreamer)

{
  zet_pfnMetricStreamerClose_t pfnClose;
  ze_result_t result;
  zet_metric_streamer_handle_t hMetricStreamer_local;
  
  pfnClose._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c8f0 != (code *)0x0) {
    pfnClose._4_4_ = (*DAT_0011c8f0)(hMetricStreamer);
  }
  return pfnClose._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricStreamerClose(
        zet_metric_streamer_handle_t hMetricStreamer    ///< [in][release] handle of the metric streamer
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnClose = context.zetDdiTable.MetricStreamer.pfnClose;
        if( nullptr != pfnClose )
        {
            result = pfnClose( hMetricStreamer );
        }
        else
        {
            // generic implementation

        }

        return result;
    }